

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O3

void __thiscall Clasp::Lookahead::undoLevel(Lookahead *this,Solver *s)

{
  size_type sVar1;
  NodeId NVar2;
  pointer pLVar3;
  pointer puVar4;
  pointer pLVar5;
  uint uVar6;
  ulong uVar7;
  pointer pLVar8;
  ulong uVar9;
  long lVar10;
  uint local_24;
  Memcpy<Clasp::Literal> local_20;
  
  sVar1 = (s->levels_).super_type.ebo_.size;
  if (sVar1 == (this->saved_).ebo_.size) {
    PostPropagator::cancelPropagation(&this->super_PostPropagator);
    pLVar3 = (s->assign_).trail.ebo_.buf;
    ScoreLook::scoreLits
              (&this->score,s,
               (Literal *)
               ((long)&pLVar3->rep_ +
               (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf +
                                     ((s->levels_).super_type.ebo_.size - 1)) << 2)),
               pLVar3 + (s->assign_).trail.ebo_.size);
    uVar6 = (s->levels_).super_type.ebo_.size;
    if (uVar6 == ((((this->nodes_).ebo_.buf)->lit).rep_ & 1)) {
      pLVar3 = (s->assign_).trail.ebo_.buf;
      uVar7 = (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf + (uVar6 - 1)) << 2);
      uVar6 = *(uint *)((long)&pLVar3->rep_ + uVar7);
      if ((uVar6 & 1) == 0) {
        if (0xbfffffff <
            *(uint *)(&((this->score).score.ebo_.buf)->field_0x0 + (uVar6 & 0xfffffffc))) {
          pLVar3 = (this->imps_).ebo_.buf;
          uVar7 = (ulong)(this->imps_).ebo_.size;
          pLVar8 = pLVar3;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            puVar4 = (s->assign_).assign_.ebo_.buf;
            lVar10 = 0;
            do {
              uVar6 = *(uint *)((long)&pLVar3->rep_ + lVar10);
              if ((byte)(*(byte *)((long)puVar4 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
                  (byte)(2U - ((uVar6 & 2) == 0))) {
                pLVar8->rep_ = uVar6;
                pLVar8 = pLVar8 + 1;
              }
              lVar10 = lVar10 + 4;
            } while (uVar7 << 2 != lVar10);
            uVar7 = (ulong)(this->imps_).ebo_.size;
          }
          (this->imps_).ebo_.size =
               (int)uVar7 - (int)((long)pLVar3 + (uVar7 * 4 - (long)pLVar8) >> 2);
        }
      }
      else {
        uVar9 = (ulong)(s->assign_).trail.ebo_.size * 4 - uVar7 >> 2;
        local_20.first_ = (Literal *)((long)&pLVar3[1].rep_ + uVar7);
        uVar7 = 0x800;
        if ((uint)uVar9 < 0x800) {
          uVar7 = uVar9 & 0xffffffff;
        }
        (this->imps_).ebo_.size = 0;
        bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
        insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
                  ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&this->imps_,
                   (this->imps_).ebo_.buf,(uint)(uVar7 * 4 + 0x3fffffffc >> 2),&local_20);
      }
    }
  }
  else {
    local_24 = 0;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->saved_,sVar1 + 1,&local_24);
    uVar6 = (this->saved_).ebo_.size - 1;
    uVar7 = (ulong)(this->saved_).ebo_.buf[uVar6];
    (this->saved_).ebo_.size = uVar6;
    if (uVar7 != 1) {
      pLVar5 = (this->nodes_).ebo_.buf;
      NVar2 = pLVar5[1].next;
      pLVar5[1].next = pLVar5[uVar7].next;
      pLVar5[uVar7].next = pLVar5->next;
      pLVar5->next = NVar2;
    }
    uVar7 = (ulong)(this->score).deps.ebo_.size;
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        (this->score).score.ebo_.buf[(this->score).deps.ebo_.buf[uVar9]] = (VarScore)0x0;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    (this->score).deps.ebo_.size = 0;
    (this->score).best = 0;
    (this->score).limit = 0xffffffff;
  }
  return;
}

Assistant:

void Lookahead::undoLevel(Solver& s) {
	if (s.decisionLevel() == saved_.size()) {
		cancelPropagation();
		const LitVec& a = s.trail();
		score.scoreLits(s, &a[0]+s.levelStart(s.decisionLevel()), &a[0]+a.size());
		if (s.decisionLevel() == static_cast<uint32>(head()->lit.flagged())) {
			const Literal* b = &a[0]+s.levelStart(s.decisionLevel());
			if (b->flagged()) {
				// remember current DL for b
				uint32 dist = static_cast<uint32>(((&a[0]+a.size()) - b));
				imps_.assign(b+1, b + std::min(dist, uint32(2048)));
			}
			else if (score.score[b->var()].testedBoth()) {
				// all true lits in imps_ follow from both *b and ~*b
				// and are therefore implied
				LitVec::iterator j = imps_.begin();
				for (LitVec::iterator it = imps_.begin(), end = imps_.end(); it != end; ++it) {
					if (s.isTrue(*it)) { *j++ = *it; }
				}
				imps_.erase(j, imps_.end());
			}
		}
	}
	else {
		assert(saved_.size() >= s.decisionLevel()+1);
		saved_.resize(s.decisionLevel()+1);
		NodeId n = saved_.back();
		saved_.pop_back();
		splice(n);
		assert(node(last_)->next == head_id);
		score.clearDeps();
	}
}